

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O2

void __thiscall helics::PotentialInterfacesManager::initialize(PotentialInterfacesManager *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/PotentialInterfacesManager.cpp:87:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/PotentialInterfacesManager.cpp:87:9)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  (*this->corePtr->_vptr_Core[0x5f])
            (this->corePtr,(ulong)(uint)(this->fedPtr->fedID).fid,&local_28,2);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void PotentialInterfacesManager::initialize()
{
    corePtr->setQueryCallback(
        fedPtr->getID(),
        [this](std::string_view query) { return generateQueryResponse(query); },
        2);
}